

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cdn_describe_user_domains.cc
# Opt level: O0

void anon_unknown.dwarf_3d8f9::Json2Type(Value *value,CdnDescribeUserDomainsPageDataType *item)

{
  bool bVar1;
  Value *pVVar2;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  CdnDescribeUserDomainsPageDataType *local_18;
  CdnDescribeUserDomainsPageDataType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (CdnDescribeUserDomainsPageDataType *)value;
  bVar1 = Json::Value::isMember(value,"DomainName");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"DomainName");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar2);
    std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Cname");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Cname");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->cname,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"CdnType");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"CdnType");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->cdn_type,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"DomainStatus");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"DomainStatus");
    Json::Value::asString_abi_cxx11_(&local_98,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->domain_status,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"GmtCreated");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"GmtCreated");
    Json::Value::asString_abi_cxx11_(&local_b8,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->gmt_created,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"GmtModified");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"GmtModified");
    Json::Value::asString_abi_cxx11_(&local_d8,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->gmt_modified,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, CdnDescribeUserDomainsPageDataType* item) {
  if(value.isMember("DomainName")) {
    item->domain_name = value["DomainName"].asString();
  }
  if(value.isMember("Cname")) {
    item->cname = value["Cname"].asString();
  }
  if(value.isMember("CdnType")) {
    item->cdn_type = value["CdnType"].asString();
  }
  if(value.isMember("DomainStatus")) {
    item->domain_status = value["DomainStatus"].asString();
  }
  if(value.isMember("GmtCreated")) {
    item->gmt_created = value["GmtCreated"].asString();
  }
  if(value.isMember("GmtModified")) {
    item->gmt_modified = value["GmtModified"].asString();
  }
}